

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator=
          (Fad<Fad<double>_> *this,
          FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_> *fadexpr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Fad<Fad<double>_> *in_RDI;
  int i_1;
  int i;
  Fad<double> *dxp;
  int sz;
  Fad<double> *in_stack_ffffffffffffff38;
  Fad<double> *in_stack_ffffffffffffff40;
  Fad<double> *this_00;
  FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_> *in_stack_ffffffffffffff48;
  Fad<double> local_98;
  FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_> local_78;
  int local_58;
  int in_stack_ffffffffffffffcc;
  Vector<Fad<double>_> *in_stack_ffffffffffffffd0;
  int local_24;
  
  iVar2 = FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>::size
                    ((FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_> *)0x1e6f591);
  iVar3 = Vector<Fad<double>_>::size((Vector<Fad<double>_> *)0x1e6f5b1);
  if (iVar2 != iVar3) {
    Vector<Fad<double>_>::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  if (iVar2 != 0) {
    Vector<Fad<double>_>::begin(&in_RDI->dx_);
    bVar1 = FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>::hasFastAccess
                      ((FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_> *)0x1e6f601);
    if (bVar1) {
      for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
        FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>::fastAccessDx
                  (in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
        Fad<double>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        Fad<double>::~Fad(in_stack_ffffffffffffff40);
      }
    }
    else {
      for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
        FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>::dx
                  (&local_78,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
        Fad<double>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        Fad<double>::~Fad(in_stack_ffffffffffffff40);
      }
    }
  }
  this_00 = &local_98;
  FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>::val
            ((FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_> *)in_stack_ffffffffffffff38
            );
  Fad<double>::operator=(this_00,in_stack_ffffffffffffff38);
  Fad<double>::~Fad(this_00);
  return in_RDI;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}